

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnAtomicStoreExpr
          (BinaryReaderIR *this,Opcode opcode,uint32_t alignment_log2,Address offset)

{
  Result RVar1;
  Opcode local_34;
  Address local_30;
  Opcode opcode_local;
  Address offset_local;
  Expr *local_20;
  
  opcode_local.enum_ = 1 << ((byte)alignment_log2 & 0x1f);
  local_34.enum_ = opcode.enum_;
  local_30 = offset;
  MakeUnique<wabt::LoadStoreExpr<(wabt::ExprType)3>,wabt::Opcode&,int,unsigned_int&>
            ((wabt *)&local_20,&local_34,(int *)&opcode_local,&local_30);
  _offset_local = local_20;
  local_20 = (Expr *)0x0;
  RVar1 = AppendExpr(this,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&offset_local)
  ;
  if (_offset_local != (Expr *)0x0) {
    (**(code **)(*(long *)_offset_local + 8))();
  }
  if (local_20 != (Expr *)0x0) {
    (**(code **)(*(long *)local_20 + 8))();
  }
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnAtomicStoreExpr(Opcode opcode,
                                         uint32_t alignment_log2,
                                         Address offset) {
  return AppendExpr(
      MakeUnique<AtomicStoreExpr>(opcode, 1 << alignment_log2, offset));
}